

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_filter_by_ext.c
# Opt level: O3

int archive_write_set_format_filter_by_ext_def(archive *a,char *filename,char *def_ext)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = get_array_index(filename);
  if (((int)uVar1 < 0) && (uVar1 = get_array_index(def_ext), (int)uVar1 < 0)) {
    archive_set_error(a,0x16,"No such format \'%s\'",filename);
    a->state = 0x8000;
    return -0x1e;
  }
  iVar2 = (*names[uVar1].format)(a);
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = (*names[uVar1].filter)(a);
  return iVar2;
}

Assistant:

int
archive_write_set_format_filter_by_ext_def(struct archive *a, const char *filename, const char * def_ext)
{
  int names_index = get_array_index(filename);
  
  if (names_index < 0)
    names_index = get_array_index(def_ext);
  
  if (names_index >= 0)
  {  
    int format_state = (names[names_index].format)(a);
    if (format_state == ARCHIVE_OK)
      return ((names[names_index].filter)(a));
    else
      return format_state;
  }    

  archive_set_error(a, EINVAL, "No such format '%s'", filename);
  a->state = ARCHIVE_STATE_FATAL;
  return (ARCHIVE_FATAL);
}